

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall
sznet::net::TcpConnection::TcpConnection
          (TcpConnection *this,EventLoop *loop,string *nameArg,uint32_t id,sz_sock sockfd,
          InetAddress *localAddr,InetAddress *peerAddr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  LogLevel LVar4;
  EventLoop *pEVar5;
  Socket *this_00;
  Channel *this_01;
  Timestamp TVar6;
  pointer pCVar7;
  LogStream *pLVar8;
  self *psVar9;
  pointer this_02;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1170 [12];
  Logger local_1160;
  TcpConnection *local_190;
  code *local_188;
  undefined8 local_180;
  type local_178;
  EventCallback local_160;
  TcpConnection *local_140;
  code *local_138;
  undefined8 local_130;
  type local_128;
  EventCallback local_110;
  TcpConnection *local_f0;
  code *local_e8;
  undefined8 local_e0;
  type local_d8;
  EventCallback local_c0;
  TcpConnection *local_a0;
  code *local_98;
  undefined8 local_90;
  type local_88;
  ReadEventCallback local_70;
  SourceFile local_40;
  InetAddress *local_30;
  InetAddress *localAddr_local;
  sz_sock sockfd_local;
  uint32_t id_local;
  string *nameArg_local;
  EventLoop *loop_local;
  TcpConnection *this_local;
  
  local_30 = localAddr;
  localAddr_local._0_4_ = sockfd;
  localAddr_local._4_4_ = id;
  _sockfd_local = nameArg;
  nameArg_local = (string *)loop;
  loop_local = (EventLoop *)this;
  std::enable_shared_from_this<sznet::net::TcpConnection>::enable_shared_from_this
            (&this->super_enable_shared_from_this<sznet::net::TcpConnection>);
  Logger::SourceFile::SourceFile<104>
            (&local_40,
             (char (*) [104])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
            );
  file.m_data = (char *)(ulong)(uint)local_40.m_size;
  file._8_8_ = 0x1f;
  pEVar5 = CheckNotNull<sznet::net::EventLoop>
                     ((sznet *)local_40.m_data,file,0x1848e2,(char *)nameArg_local,
                      (EventLoop *)localAddr);
  this->m_loop = pEVar5;
  std::__cxx11::string::string((string *)&this->m_name,(string *)_sockfd_local);
  this->m_id = localAddr_local._4_4_;
  this->m_state = kConnecting;
  this->m_reading = true;
  this_00 = (Socket *)operator_new(8);
  Socket::Socket(this_00,(sz_sock)localAddr_local,true);
  std::unique_ptr<sznet::net::Socket,std::default_delete<sznet::net::Socket>>::
  unique_ptr<std::default_delete<sznet::net::Socket>,void>
            ((unique_ptr<sznet::net::Socket,std::default_delete<sznet::net::Socket>> *)
             &this->m_socket,this_00);
  this_01 = (Channel *)operator_new(0xb8);
  Channel::Channel(this_01,(EventLoop *)nameArg_local,(sz_sock)localAddr_local);
  std::unique_ptr<sznet::net::Channel,std::default_delete<sznet::net::Channel>>::
  unique_ptr<std::default_delete<sznet::net::Channel>,void>
            ((unique_ptr<sznet::net::Channel,std::default_delete<sznet::net::Channel>> *)
             &this->m_channel,this_01);
  uVar1 = *(undefined8 *)&local_30->field_0;
  uVar2 = *(undefined8 *)((long)&local_30->field_0 + 8);
  uVar3 = *(undefined8 *)((long)&local_30->field_0 + 0x14);
  *(undefined8 *)((long)&(this->m_localAddr).field_0 + 0xc) =
       *(undefined8 *)((long)&local_30->field_0 + 0xc);
  *(undefined8 *)((long)&(this->m_localAddr).field_0 + 0x14) = uVar3;
  *(undefined8 *)&(this->m_localAddr).field_0 = uVar1;
  *(undefined8 *)((long)&(this->m_localAddr).field_0 + 8) = uVar2;
  uVar1 = *(undefined8 *)&peerAddr->field_0;
  uVar2 = *(undefined8 *)((long)&peerAddr->field_0 + 8);
  uVar3 = *(undefined8 *)((long)&peerAddr->field_0 + 0x14);
  *(undefined8 *)((long)&(this->m_peerAddr).field_0 + 0xc) =
       *(undefined8 *)((long)&peerAddr->field_0 + 0xc);
  *(undefined8 *)((long)&(this->m_peerAddr).field_0 + 0x14) = uVar3;
  *(undefined8 *)&(this->m_peerAddr).field_0 = uVar1;
  *(undefined8 *)((long)&(this->m_peerAddr).field_0 + 8) = uVar2;
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::function
            (&this->m_connectionCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::function(&this->m_messageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::function
            (&this->m_writeCompleteCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>::function
            (&this->m_highWaterMarkCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::function
            (&this->m_closeCallback);
  this->m_highWaterMark = 0x4000000;
  Buffer::Buffer(&this->m_inputBuffer,4,0x400);
  Buffer::Buffer(&this->m_outputBuffer,4,0x400);
  NetStatInfo::NetStatInfo(&this->m_netStatInfo);
  NetStatInfo::NetStatInfo(&this->m_prevNetStatInfo);
  TVar6 = Timestamp::now();
  (this->m_calcNetLastTime).m_microSecondsSinceEpoch = TVar6.m_microSecondsSinceEpoch;
  pCVar7 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_channel);
  local_98 = handleRead;
  local_90 = 0;
  local_a0 = this;
  std::
  bind<void(sznet::net::TcpConnection::*)(sznet::Timestamp),sznet::net::TcpConnection*,std::_Placeholder<1>const&>
            (&local_88,(offset_in_TcpConnection_to_subr *)&local_98,&local_a0,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(sznet::Timestamp)>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*,std::_Placeholder<1>))(sznet::Timestamp)>,void>
            ((function<void(sznet::Timestamp)> *)&local_70,&local_88);
  Channel::setReadCallback(pCVar7,&local_70);
  std::function<void_(sznet::Timestamp)>::~function(&local_70);
  pCVar7 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_channel);
  local_e8 = handleWrite;
  local_e0 = 0;
  local_f0 = this;
  std::bind<void(sznet::net::TcpConnection::*)(),sznet::net::TcpConnection*>
            (&local_d8,(offset_in_TcpConnection_to_subr *)&local_e8,&local_f0);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*))()>,void>
            ((function<void()> *)&local_c0,&local_d8);
  Channel::setWriteCallback(pCVar7,&local_c0);
  std::function<void_()>::~function(&local_c0);
  pCVar7 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_channel);
  local_138 = handleClose;
  local_130 = 0;
  local_140 = this;
  std::bind<void(sznet::net::TcpConnection::*)(),sznet::net::TcpConnection*>
            (&local_128,(offset_in_TcpConnection_to_subr *)&local_138,&local_140);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*))()>,void>
            ((function<void()> *)&local_110,&local_128);
  Channel::setCloseCallback(pCVar7,&local_110);
  std::function<void_()>::~function(&local_110);
  pCVar7 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_channel);
  local_188 = handleError;
  local_180 = 0;
  local_190 = this;
  std::bind<void(sznet::net::TcpConnection::*)(),sznet::net::TcpConnection*>
            (&local_178,(offset_in_TcpConnection_to_subr *)&local_188,&local_190);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*))()>,void>
            ((function<void()> *)&local_160,&local_178);
  Channel::setErrorCallback(pCVar7,&local_160);
  std::function<void_()>::~function(&local_160);
  LVar4 = Logger::logLevel();
  if ((int)LVar4 < 2) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_1170,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_1170._0_8_;
    file_00.m_size = local_1170._8_4_;
    Logger::Logger(&local_1160,file_00,0x33,DEBUG,"TcpConnection");
    pLVar8 = Logger::stream(&local_1160);
    psVar9 = LogStream::operator<<(pLVar8,"TcpConnection::ctor[");
    psVar9 = LogStream::operator<<(psVar9,&this->m_name);
    psVar9 = LogStream::operator<<(psVar9,"] at ");
    pLVar8 = LogStream::operator<<(psVar9,this);
    psVar9 = LogStream::operator<<(pLVar8," fd=");
    LogStream::operator<<(psVar9,(sz_sock)localAddr_local);
    Logger::~Logger(&local_1160);
  }
  this_02 = std::unique_ptr<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>::
            operator->(&this->m_socket);
  Socket::setKeepAlive(this_02,true);
  return;
}

Assistant:

TcpConnection::TcpConnection(EventLoop* loop, const string& nameArg, const uint32_t id, sockets::sz_sock sockfd, const InetAddress& localAddr, const InetAddress& peerAddr): 
	m_loop(CHECK_NOTNULL(loop)),
	m_name(nameArg),
	m_id(id),
	m_state(kConnecting),
	m_reading(true),
	m_socket(new Socket(sockfd)),
	m_channel(new Channel(loop, sockfd)),
	m_localAddr(localAddr),
	m_peerAddr(peerAddr),
	m_highWaterMark(64 * 1024 * 1024),
	m_calcNetLastTime(Timestamp::now())
{
	// ���ÿɶ�
	m_channel->setReadCallback(std::bind(&TcpConnection::handleRead, this, std::placeholders::_1));
	// ���ÿ�д
	m_channel->setWriteCallback(std::bind(&TcpConnection::handleWrite, this));
	// ���ùر�
	m_channel->setCloseCallback(std::bind(&TcpConnection::handleClose, this));
	// ���ô���
	m_channel->setErrorCallback(std::bind(&TcpConnection::handleError, this));
	LOG_DEBUG << "TcpConnection::ctor[" << m_name << "] at " << this << " fd=" << sockfd;
	// ��������
	m_socket->setKeepAlive(true);
}